

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Detonation_PDU::Detonation_PDU
          (Detonation_PDU *this,EntityIdentifier *FiringEntID,EntityIdentifier *TargetEntID,
          EntityIdentifier *MunitionID,EntityIdentifier *EventID,Vector *Velocity,
          WorldCoordinates *LocationWorldCoords,DescPtr *Desc,Vector *LocationEntityCoords,
          DetonationResult DetonationResult)

{
  KFLOAT64 KVar1;
  KFLOAT32 KVar2;
  DescPtr local_48;
  
  Warfare_Header::Warfare_Header
            (&this->super_Warfare_Header,FiringEntID,TargetEntID,MunitionID,EventID);
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Detonation_PDU_00223470;
  (this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002241d0;
  KVar2 = Velocity->m_f32Y;
  (this->m_Velocity).m_f32X = Velocity->m_f32X;
  (this->m_Velocity).m_f32Y = KVar2;
  (this->m_Velocity).m_f32Z = Velocity->m_f32Z;
  (this->m_LocationWorldCoords).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00224228;
  KVar1 = LocationWorldCoords->m_f64Y;
  (this->m_LocationWorldCoords).m_f64X = LocationWorldCoords->m_f64X;
  (this->m_LocationWorldCoords).m_f64Y = KVar1;
  (this->m_LocationWorldCoords).m_f64Z = LocationWorldCoords->m_f64Z;
  (this->m_pDescriptor)._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_002234c8;
  (this->m_pDescriptor).m_pRef = (Descriptor *)0x0;
  (this->m_pDescriptor).m_piCount = (RefCounter *)0x0;
  (this->m_LocationEntityCoords).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002241d0;
  KVar2 = LocationEntityCoords->m_f32Y;
  (this->m_LocationEntityCoords).m_f32X = LocationEntityCoords->m_f32X;
  (this->m_LocationEntityCoords).m_f32Y = KVar2;
  (this->m_LocationEntityCoords).m_f32Z = LocationEntityCoords->m_f32Z;
  this->m_ui8DetonationResult = (undefined1)DetonationResult;
  this->m_ui8NumOfVariableParams = '\0';
  this->m_ui16Padding1 = 0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8PDUType = '\x03';
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui16PDULength = 0x68;
  local_48._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_002234c8;
  local_48.m_pRef = Desc->m_pRef;
  local_48.m_piCount = Desc->m_piCount;
  if (local_48.m_pRef != (Descriptor *)0x0) {
    *local_48.m_piCount = *local_48.m_piCount + 1;
  }
  SetDescriptor(this,&local_48);
  local_48._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_002234c8;
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::unRef(&local_48);
  return;
}

Assistant:

Detonation_PDU::Detonation_PDU( const EntityIdentifier & FiringEntID, const EntityIdentifier & TargetEntID,
                                const EntityIdentifier & MunitionID, const EntityIdentifier & EventID ,
                                const Vector & Velocity, const WorldCoordinates & LocationWorldCoords,
                                DescPtr Desc, const Vector & LocationEntityCoords,
                                DetonationResult DetonationResult ) :
    Warfare_Header( FiringEntID, TargetEntID, MunitionID, EventID ),
    m_Velocity( Velocity ),
    m_LocationWorldCoords( LocationWorldCoords ),
    m_LocationEntityCoords( LocationEntityCoords ),
    m_ui8DetonationResult( DetonationResult ),
    m_ui8NumOfVariableParams( 0 ),
    m_ui16Padding1( 0 )
{
    m_ui8PDUType = Detonation_PDU_Type;
    m_ui16PDULength = DETONATION_PDU_SIZE;
    SetDescriptor( Desc );
}